

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_sonarqube.hpp
# Opt level: O2

void __thiscall
Catch::SonarQubeReporter::writeAssertions
          (SonarQubeReporter *this,SectionNode *sectionNode,bool okToFail)

{
  pointer pAVar1;
  AssertionStats *assertion;
  pointer stats;
  
  pAVar1 = (sectionNode->assertions).
           super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>._M_impl
           .super__Vector_impl_data._M_finish;
  for (stats = (sectionNode->assertions).
               super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>.
               _M_impl.super__Vector_impl_data._M_start; stats != pAVar1; stats = stats + 1) {
    writeAssertion(this,stats,okToFail);
  }
  return;
}

Assistant:

void writeAssertions(SectionNode const& sectionNode, bool okToFail) {
            for(auto const& assertion : sectionNode.assertions)
                writeAssertion( assertion, okToFail);
        }